

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z2.c
# Opt level: O3

LispPTR N_OP_classoc(LispPTR key,LispPTR list)

{
  uint uVar1;
  LispPTR LVar2;
  cadr_cell cVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = key & 0xfff0000;
  uVar1 = 0xffffffff;
  if (uVar4 < 0xe0000) {
    if ((uVar4 == 0) || (uVar4 == 0x70000)) {
LAB_0013f269:
      if ((list != 0) &&
         ((*(ushort *)((ulong)(list >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5)) {
        cVar3 = cadr(list);
        do {
          if (((*(ushort *)((ulong)(MDStypetbl + ((ulong)cVar3 >> 9 & 0x7fffff)) ^ 2) & 0x7ff) == 5)
             && (LVar2 = car(cVar3.car_cell), LVar2 == key)) goto LAB_0013f32f;
          if ((*(ushort *)((ulong)(MDStypetbl + ((ulong)cVar3 >> 0x29)) ^ 2) & 0x7ff) != 5) {
            cVar3.car_cell = 0;
            cVar3.cdr_cell = 0;
            list = 0;
            if (MachineState.irqend != 0) goto LAB_0013f32f;
LAB_0013f317:
            uVar1 = 0xfffffffe;
            goto LAB_0013f31c;
          }
          uVar5 = (ulong)cVar3 >> 0x20;
          list = cVar3.cdr_cell;
          cVar3 = cadr(list);
          if (MachineState.irqend == 0) goto LAB_0013f317;
        } while (uVar5 != 0);
      }
      cVar3.car_cell = 0;
      cVar3.cdr_cell = 0;
      goto LAB_0013f32f;
    }
  }
  else if ((uVar4 == 0xf0000) || (uVar4 == 0xe0000)) goto LAB_0013f269;
LAB_0013f31c:
  MachineState.errorexit = 1;
  cVar3.cdr_cell = 0;
  cVar3.car_cell = uVar1;
  MachineState.tosvalue = list;
LAB_0013f32f:
  return cVar3.car_cell;
}

Assistant:

LispPTR N_OP_classoc(LispPTR key, LispPTR list) {
  struct cadr_cell cadr1;
  LispPTR cdrcell; /* address of (cdr A-list); Lisp address */

  switch (key & SEGMASK) {
    case S_POSITIVE: break;
    case S_NEGATIVE: break;
    case S_CHARACTER: break;
    case ATOM_OFFSET: break;
    default: ERROR_EXIT(list);
  }
  /* JRB - Don Charnley claims the code below should be identical to the
        code in IL:ASSOC, so I copied my new and exciting version over */

  if (list == NIL_PTR) { return (NIL_PTR); }

  if (GetTypeNumber(list) != TYPE_LISTP) { return (NIL_PTR); }

  S_N_CHECKANDCADR(list, cadr1, list);

  do {
    cdrcell = cadr1.cdr_cell; /* the rest of A-list */
    if (Listp(cadr1.car_cell) && key == car(cadr1.car_cell)) {
      /* cons data found */
      return (cadr1.car_cell);
    }
    /* search the rest of A-list */
    if (Listp(cdrcell))
      cadr1 = cadr(cdrcell);
    else
      cdrcell = NIL;
    /* check for interrupts and punt to handle one safely */
    if (!Irq_Stk_End) {
      TopOfStack = cdrcell; /* for continuation */
      TIMER_EXIT(cdrcell);
    }
  } while (cdrcell != NIL_PTR);

  return (NIL_PTR);
}